

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O2

void Gia_MmStepEntryRecycle(Gia_MmStep_t *p,char *pEntry,int nBytes)

{
  Gia_MmFixed_t *pGVar1;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    pGVar1 = p->pMap[nBytes];
    pGVar1->nEntriesUsed = pGVar1->nEntriesUsed + -1;
    *(char **)pEntry = pGVar1->pEntriesFree;
    pGVar1->pEntriesFree = pEntry;
  }
  return;
}

Assistant:

void Gia_MmStepEntryRecycle( Gia_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Gia_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}